

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

image * __thiscall basisu::image::flip_y(image *this)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 aVar1;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar3;
  uint32_t y;
  uint y_00;
  uint32_t x;
  uint x_00;
  
  for (y_00 = 0; y_00 < this->m_height >> 1; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < this->m_width; x_00 = x_00 + 1) {
      paVar2 = &operator()(this,x_00,y_00)->field_0;
      paVar3 = &operator()(this,x_00,this->m_height + ~y_00)->field_0;
      aVar1 = *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)paVar2;
      paVar2->field_1 =
           *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)paVar3;
      paVar3->field_1 = aVar1;
    }
  }
  return this;
}

Assistant:

image &flip_y()
		{
			for (uint32_t y = 0; y < m_height / 2; ++y)
				for (uint32_t x = 0; x < m_width; ++x)
					std::swap((*this)(x, y), (*this)(x, m_height - 1 - y));
			return *this;
		}